

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::VariableWalkerBase::Get(VariableWalkerBase *this,int i,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Type *ppDVar6;
  PropertyRecord *this_00;
  char16 *pcVar7;
  undefined4 extraout_var_00;
  RecyclableObject *this_01;
  undefined4 extraout_var_01;
  PropertyRecord *propertyRecord;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  VariableWalkerBase *this_local;
  TypeId local_18;
  TypeId typeId;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x166,"(pResolvedObject)","Bad usage of VariableWalkerBase::Get");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x168,"(pFrame)","pFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  if (i < 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar3 = GetMemberCount(this);
    if (i < iVar3) {
      ppDVar6 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pMembersList,i);
      pResolvedObject->propId = (*ppDVar6)->propId;
      if (pResolvedObject->propId == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x173,"(pResolvedObject->propId != Js::Constants::NoProperty)",
                                    "pResolvedObject->propId != Js::Constants::NoProperty");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      BVar4 = IsInternalPropertyId(pResolvedObject->propId);
      if (BVar4 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x174,"(!Js::IsInternalPropertyId(pResolvedObject->propId))",
                                    "!Js::IsInternalPropertyId(pResolvedObject->propId)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((pResolvedObject->propId == 0x2d6) || (pResolvedObject->propId == 0x2d7)) {
        pResolvedObject->name = L"super";
      }
      else {
        this_00 = ScriptContext::GetPropertyName
                            (pResolvedObject->scriptContext,pResolvedObject->propId);
        pcVar7 = PropertyRecord::GetBuffer(this_00);
        pResolvedObject->name = pcVar7;
      }
      iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[6])
                        (this,(ulong)(uint)i);
      pResolvedObject->obj = (Var)CONCAT44(extraout_var_00,iVar3);
      if (pResolvedObject->obj == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x182,"(pResolvedObject->obj)","pResolvedObject->obj");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      aValue = pResolvedObject->obj;
      if (aValue == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = TaggedInt::Is(aValue);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
          if (this_01 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(this_01);
          if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(this_01), BVar4 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
      }
      pResolvedObject->typeId = local_18;
      iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[5])
                        (this,(ulong)(uint)i);
      pResolvedObject->address = (IDiagObjectAddress *)CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[7])
                        (this,(ulong)(uint)i);
      pResolvedObject->isConst = (bool)((byte)iVar3 & 1);
      pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)0x0;
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL VariableWalkerBase::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of VariableWalkerBase::Get");

        Assert(pFrame);
        pResolvedObject->scriptContext    = pFrame->GetScriptContext();

        if (i < 0)
        {
            return FALSE;
        }

        if (GetMemberCount() > i)
        {
            pResolvedObject->propId           = pMembersList->Item(i)->propId;
            Assert(pResolvedObject->propId != Js::Constants::NoProperty);
            Assert(!Js::IsInternalPropertyId(pResolvedObject->propId));

            if (pResolvedObject->propId == Js::PropertyIds::_super || pResolvedObject->propId == Js::PropertyIds::_superConstructor)
            {
                pResolvedObject->name         = _u("super");
            }
            else
            {
                const Js::PropertyRecord* propertyRecord = pResolvedObject->scriptContext->GetPropertyName(pResolvedObject->propId);
                pResolvedObject->name         = propertyRecord->GetBuffer();
            }


            pResolvedObject->obj              = GetVarObjectAt(i);
            Assert(pResolvedObject->obj);

            pResolvedObject->typeId           = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            pResolvedObject->address          = GetObjectAddress(i);
            pResolvedObject->isConst          = IsConstAt(i);

            pResolvedObject->objectDisplay    = nullptr;
            return TRUE;
        }

        return FALSE;
    }